

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O0

void __thiscall
OStreamTest_CustomArg_Test::~OStreamTest_CustomArg_Test(OStreamTest_CustomArg_Test *this)

{
  void *in_RDI;
  
  ~OStreamTest_CustomArg_Test((OStreamTest_CustomArg_Test *)0x116528);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(OStreamTest, CustomArg) {
  fmt::memory_buffer buffer;
  fmt::internal::buffer &base = buffer;
  fmt::format_context ctx(std::back_inserter(base), "", fmt::format_args());
  fmt::format_specs spec;
  test_arg_formatter af(ctx, spec);
  visit(af, fmt::internal::make_arg<fmt::format_context>(TestEnum()));
  EXPECT_EQ("TestEnum", std::string(buffer.data(), buffer.size()));
}